

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstandarditemmodel.cpp
# Opt level: O2

void __thiscall
QStandardItemModel::QStandardItemModel
          (QStandardItemModel *this,int rows,int columns,QObject *parent)

{
  QStandardItemModelPrivate *this_00;
  QStandardItemModelPrivate *this_01;
  
  this_01 = (QStandardItemModelPrivate *)operator_new(0x128);
  QStandardItemModelPrivate::QStandardItemModelPrivate(this_01);
  QAbstractItemModel::QAbstractItemModel
            ((QAbstractItemModel *)this,(QAbstractItemModelPrivate *)this_01,(QObject *)parent);
  *(undefined ***)this = &PTR_metaObject_007878b0;
  this_00 = *(QStandardItemModelPrivate **)(this + 8);
  QStandardItemModelPrivate::init(this_00,(EVP_PKEY_CTX *)this_01);
  QStandardItem::insertColumns((this_00->root).d,0,columns);
  QList<QStandardItem_*>::insert(&this_00->columnHeaderItems,0,(long)columns,(parameter_type)0x0);
  QStandardItem::insertRows((this_00->root).d,0,rows);
  QList<QStandardItem_*>::insert(&this_00->rowHeaderItems,0,(long)rows,(parameter_type)0x0);
  QStandardItemPrivate::setModel((((this_00->root).d)->d_ptr).d,(QStandardItemModel *)this);
  return;
}

Assistant:

QStandardItemModel::QStandardItemModel(int rows, int columns, QObject *parent)
    : QAbstractItemModel(*new QStandardItemModelPrivate, parent)
{
    Q_D(QStandardItemModel);
    d->init();
    d->root->insertColumns(0, columns);
    d->columnHeaderItems.insert(0, columns, nullptr);
    d->root->insertRows(0, rows);
    d->rowHeaderItems.insert(0, rows, nullptr);
    d->root->d_func()->setModel(this);
}